

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O0

pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
* __thiscall
Centaurus::ATNNode<unsigned_char>::get_entry_exit_wide
          (pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
           *__return_storage_ptr__,ATNNode<unsigned_char> *this,wstring *prefix)

{
  wstring local_60;
  wstring local_40;
  wstring *local_20;
  wstring *prefix_local;
  ATNNode<unsigned_char> *this_local;
  
  local_20 = prefix;
  prefix_local = (wstring *)this;
  this_local = (ATNNode<unsigned_char> *)__return_storage_ptr__;
  if (this->m_type == RegularTerminal) {
    NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>::get_entry_wide
              (&local_40,&(this->m_nfa).super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>,
               prefix);
    NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>::get_exit_wide
              (&local_60,&(this->m_nfa).super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>,
               local_20);
    std::
    pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::
    pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_true>
              (__return_storage_ptr__,&local_40,&local_60);
    std::__cxx11::wstring::~wstring((wstring *)&local_60);
    std::__cxx11::wstring::~wstring((wstring *)&local_40);
  }
  else {
    std::
    pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::
    pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_true>
              (__return_storage_ptr__,prefix,prefix);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::wstring, std::wstring> get_entry_exit_wide(const std::wstring& prefix) const
	{
		if (m_type == ATNNodeType::RegularTerminal)
		{
			return std::pair<std::wstring, std::wstring>(m_nfa.get_entry_wide(prefix), m_nfa.get_exit_wide(prefix));
		}
		else
		{
			return std::pair<std::wstring, std::wstring>(prefix, prefix);
		}
	}